

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O2

void GetResidual(int width,int height,uint32_t *upper_row,uint32_t *current_row,uint8_t *max_diffs,
                int mode,int x_start,int x_end,int y,int max_quantization,int exact,
                int used_subtract_green,uint32_t *out)

{
  VP8LPredictorFunc p_Var1;
  uint8_t uVar2;
  uint32_t b;
  uint uVar3;
  byte bVar4;
  char cVar5;
  byte bVar6;
  uint quantization;
  long lVar7;
  uint32_t uVar8;
  uint8_t uVar9;
  byte bVar10;
  uint local_88;
  
  if (exact == 0) {
    p_Var1 = VP8LPredictors[mode];
    for (lVar7 = (long)x_start; lVar7 < x_end; lVar7 = lVar7 + 1) {
      if (y == 0) {
        if (lVar7 == 0) {
          b = 0xff000000;
        }
        else {
          b = current_row[lVar7 + -1];
        }
LAB_0013eaf5:
        uVar8 = current_row[lVar7];
        uVar3 = VP8LSubPixels(uVar8,b);
      }
      else {
        if (lVar7 == 0) {
          b = *upper_row;
        }
        else {
          b = (*p_Var1)(current_row + lVar7 + -1,upper_row + lVar7);
        }
        if (((((mode == 0 || max_quantization == 1) || y == 0) || (height + -1 == y)) ||
            (lVar7 == 0)) || (lVar7 == width + -1)) goto LAB_0013eaf5;
        uVar8 = current_row[lVar7];
        uVar3 = max_quantization;
        if (max_diffs[lVar7] < 3) {
          uVar3 = VP8LSubPixels(uVar8,b);
        }
        else {
          do {
            quantization = uVar3;
            uVar3 = quantization >> 1;
          } while ((int)(uint)max_diffs[lVar7] <= (int)quantization);
          uVar9 = (uint8_t)(uVar8 >> 0x18);
          uVar2 = (uint8_t)(b >> 0x18);
          if (uVar8 < 0x1000000 || uVar8 >> 0x18 == 0xff) {
            bVar10 = uVar9 - uVar2;
          }
          else {
            bVar10 = NearLosslessComponent(uVar9,uVar2,0xff,quantization);
          }
          local_88 = (uint)bVar10;
          uVar9 = (uint8_t)(b >> 8);
          uVar2 = (uint8_t)(uVar8 >> 8);
          bVar10 = NearLosslessComponent(uVar2,uVar9,0xff,quantization);
          bVar4 = bVar10 + uVar9;
          cVar5 = bVar4 - uVar2;
          if (used_subtract_green == 0) {
            cVar5 = '\0';
          }
          bVar6 = -(used_subtract_green == 0) | ~bVar4;
          bVar4 = NearLosslessComponent
                            ((char)(uVar8 >> 0x10) - cVar5,(uint8_t)(b >> 0x10),bVar6,quantization);
          bVar6 = NearLosslessComponent((char)uVar8 - cVar5,(uint8_t)b,bVar6,quantization);
          uVar3 = (uint)bVar6 | (uint)bVar10 << 8 | (uint)bVar4 << 0x10 | local_88 << 0x18;
        }
        uVar8 = (uVar3 & 0xff00ff) + (b & 0xff00ff) & 0xff00ff |
                (uVar3 & 0xff00ff00) + (b & 0xff00ff00) & 0xff00ff00;
        current_row[lVar7] = uVar8;
      }
      if (uVar8 < 0x1000000) {
        uVar3 = uVar3 & 0xff000000;
        current_row[lVar7] = b & 0xffffff;
        if (lVar7 == 0 && y != 0) {
          upper_row[width] = *current_row;
        }
      }
      out[lVar7 - x_start] = uVar3;
    }
  }
  else {
    PredictBatch(mode,x_start,y,x_end - x_start,current_row,upper_row,out);
  }
  return;
}

Assistant:

static WEBP_INLINE void GetResidual(
    int width, int height, uint32_t* const upper_row,
    uint32_t* const current_row, const uint8_t* const max_diffs, int mode,
    int x_start, int x_end, int y, int max_quantization, int exact,
    int used_subtract_green, uint32_t* const out) {
  if (exact) {
    PredictBatch(mode, x_start, y, x_end - x_start, current_row, upper_row,
                 out);
  } else {
    const VP8LPredictorFunc pred_func = VP8LPredictors[mode];
    int x;
    for (x = x_start; x < x_end; ++x) {
      uint32_t predict;
      uint32_t residual;
      if (y == 0) {
        predict = (x == 0) ? ARGB_BLACK : current_row[x - 1];  // Left.
      } else if (x == 0) {
        predict = upper_row[x];  // Top.
      } else {
        predict = pred_func(&current_row[x - 1], upper_row + x);
      }
#if (WEBP_NEAR_LOSSLESS == 1)
      if (max_quantization == 1 || mode == 0 || y == 0 || y == height - 1 ||
          x == 0 || x == width - 1) {
        residual = VP8LSubPixels(current_row[x], predict);
      } else {
        residual = NearLossless(current_row[x], predict, max_quantization,
                                max_diffs[x], used_subtract_green);
        // Update the source image.
        current_row[x] = VP8LAddPixels(predict, residual);
        // x is never 0 here so we do not need to update upper_row like below.
      }
#else
      (void)max_diffs;
      (void)height;
      (void)max_quantization;
      (void)used_subtract_green;
      residual = VP8LSubPixels(current_row[x], predict);
#endif
      if ((current_row[x] & kMaskAlpha) == 0) {
        // If alpha is 0, cleanup RGB. We can choose the RGB values of the
        // residual for best compression. The prediction of alpha itself can be
        // non-zero and must be kept though. We choose RGB of the residual to be
        // 0.
        residual &= kMaskAlpha;
        // Update the source image.
        current_row[x] = predict & ~kMaskAlpha;
        // The prediction for the rightmost pixel in a row uses the leftmost
        // pixel
        // in that row as its top-right context pixel. Hence if we change the
        // leftmost pixel of current_row, the corresponding change must be
        // applied
        // to upper_row as well where top-right context is being read from.
        if (x == 0 && y != 0) upper_row[width] = current_row[0];
      }
      out[x - x_start] = residual;
    }
  }
}